

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::SignalEventExpressionSyntax::setChild
          (SignalEventExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  Info *pIVar1;
  undefined1 uVar2;
  NumericTokenFlags NVar3;
  uint32_t uVar4;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar5;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar6;
  ExpressionSyntax *pEVar7;
  IffEventClauseSyntax *pIVar8;
  logic_error *this_00;
  long *plVar9;
  size_type *psVar10;
  long *plVar11;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (index == 2) {
    ppSVar6 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar6 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pIVar8 = (IffEventClauseSyntax *)0x0;
    }
    else {
      ppSVar6 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pIVar8 = (IffEventClauseSyntax *)*ppSVar6;
      if ((pIVar8->super_SyntaxNode).kind != IffEventClause) {
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/syntax/SyntaxNode.h"
                   ,0x68,
                   "T &slang::syntax::SyntaxNode::as() [T = slang::syntax::IffEventClauseSyntax]");
      }
    }
    this->iffClause = pIVar8;
  }
  else if (index == 1) {
    ppSVar6 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar6 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pEVar7 = (ExpressionSyntax *)0x0;
    }
    else {
      ppSVar6 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pEVar7 = SyntaxNode::as<slang::syntax::ExpressionSyntax>(*ppSVar6);
    }
    if (pEVar7 == (ExpressionSyntax *)0x0) {
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x1b,
                 "slang::not_null<slang::syntax::ExpressionSyntax *>::not_null(U &&) [T = slang::syntax::ExpressionSyntax *, U = slang::syntax::ExpressionSyntax *]"
                );
    }
    (this->expr).ptr = pEVar7;
  }
  else {
    if (index != 0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O1/extern/slang/source/AllSyntax.cpp"
                 ,"");
      plVar9 = (long *)std::__cxx11::string::append((char *)local_90);
      local_d0._M_dataplus._M_p = (pointer)*plVar9;
      psVar10 = (size_type *)(plVar9 + 2);
      if ((size_type *)local_d0._M_dataplus._M_p == psVar10) {
        local_d0.field_2._M_allocated_capacity = *psVar10;
        local_d0.field_2._8_8_ = plVar9[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar10;
      }
      local_d0._M_string_length = plVar9[1];
      *plVar9 = (long)psVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::to_string(&local_70,0x2d9c);
      std::operator+(&local_50,&local_d0,&local_70);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_b0 = (long *)*plVar9;
      plVar11 = plVar9 + 2;
      if (local_b0 == plVar11) {
        local_a0 = *plVar11;
        lStack_98 = plVar9[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar11;
      }
      local_a8 = plVar9[1];
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_f0 = (long *)*plVar9;
      plVar11 = plVar9 + 2;
      if (local_f0 == plVar11) {
        local_e0 = *plVar11;
        lStack_d8 = plVar9[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar11;
      }
      local_e8 = plVar9[1];
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::logic_error::logic_error(this_00,(string *)&local_f0);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pvVar5 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar2 = pvVar5->field_0x2;
    NVar3.raw = (pvVar5->numFlags).raw;
    uVar4 = pvVar5->rawLen;
    pIVar1 = pvVar5->info;
    (this->edge).kind = pvVar5->kind;
    (this->edge).field_0x2 = uVar2;
    (this->edge).numFlags = (NumericTokenFlags)NVar3.raw;
    (this->edge).rawLen = uVar4;
    (this->edge).info = pIVar1;
  }
  return;
}

Assistant:

void SignalEventExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: edge = child.token(); return;
        case 1: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 2: iffClause = child.node() ? &child.node()->as<IffEventClauseSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}